

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.cpp
# Opt level: O2

DeclaredType * __thiscall slang::ast::Symbol::getDeclaredType(Symbol *this)

{
  SymbolKind SVar1;
  bool bVar2;
  
  SVar1 = this->kind;
  if (SVar1 != Coverpoint) {
    if (SVar1 == NetType) {
LAB_003001e0:
      return (DeclaredType *)(this + 1);
    }
    if (SVar1 == TypeParameter) {
      return (DeclaredType *)&this[1].location;
    }
    if ((SVar1 != Subroutine) && (SVar1 != MethodPrototype)) {
      if (SVar1 == AssertionPort) goto LAB_003001e0;
      if (SVar1 != RandSeqProduction) {
        if (SVar1 == TypeAlias) {
          return (DeclaredType *)&this[1].name;
        }
        bVar2 = isValue(this);
        if (bVar2) {
          return (DeclaredType *)(this + 1);
        }
        return (DeclaredType *)0x0;
      }
    }
  }
  return (DeclaredType *)&this[1].originatingSyntax;
}

Assistant:

const DeclaredType* Symbol::getDeclaredType() const {
    switch (kind) {
        case SymbolKind::TypeAlias:
            return &as<TypeAliasType>().targetType;
        case SymbolKind::Subroutine:
            return &as<SubroutineSymbol>().declaredReturnType;
        case SymbolKind::MethodPrototype:
            return &as<MethodPrototypeSymbol>().declaredReturnType;
        case SymbolKind::NetType:
            return &as<NetType>().declaredType;
        case SymbolKind::TypeParameter:
            return &as<TypeParameterSymbol>().targetType;
        case SymbolKind::AssertionPort:
            return &as<AssertionPortSymbol>().declaredType;
        case SymbolKind::RandSeqProduction:
            return &as<RandSeqProductionSymbol>().declaredReturnType;
        case SymbolKind::Coverpoint:
            return &as<CoverpointSymbol>().declaredType;
        default:
            if (isValue())
                return as<ValueSymbol>().getDeclaredType();
            return nullptr;
    }
}